

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

QSizeF __thiscall QGraphicsWidget::sizeHint(QGraphicsWidget *this,SizeHint which,QSizeF *constraint)

{
  QGraphicsLayoutItem *this_00;
  double *pdVar1;
  undefined1 auVar2 [12];
  double dVar3;
  double dVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  QSizeF QVar7;
  QSizeF local_28;
  undefined4 uStack_18;
  undefined4 local_14;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsLayoutItem **)(*(long *)(this + 0x18) + 0x180);
  if (this_00 == (QGraphicsLayoutItem *)0x0) {
    if (which < MinimumDescent) {
      dVar5 = *(double *)(&DAT_0067bdf0 + (ulong)which * 8);
      dVar6 = dVar5;
    }
    else {
      local_28.wd._0_4_ = 2;
      local_14 = 0;
      local_28._4_8_ = 0;
      local_28.ht._4_4_ = 0;
      uStack_18 = 0;
      local_10 = "default";
      QMessageLogger::warning
                ((char *)&local_28,
                 "QGraphicsWidget::sizeHint(): Don\'t know how to handle the value of \'which\'");
      dVar5 = -1.0;
      dVar6 = -1.0;
    }
  }
  else {
    pdVar1 = *(double **)(*(long *)(this + 0x18) + 0x178);
    if (pdVar1 == (double *)0x0) {
      dVar5 = 0.0;
      dVar6 = 0.0;
    }
    else {
      dVar5 = pdVar1[2] + *pdVar1;
      dVar6 = pdVar1[3] + pdVar1[1];
    }
    dVar3 = constraint->wd - dVar5;
    dVar4 = constraint->ht - dVar6;
    local_28.ht._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
    auVar2._8_4_ = SUB84(dVar4,0);
    auVar2._0_8_ = dVar3;
    local_28.wd._0_4_ = SUB84(dVar3,0);
    local_28._4_8_ = auVar2._4_8_;
    QVar7 = QGraphicsLayoutItem::effectiveSizeHint(this_00,which,&local_28);
    dVar5 = QVar7.wd + dVar5;
    dVar6 = QVar7.ht + dVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar7.ht = dVar6;
    QVar7.wd = dVar5;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGraphicsWidget::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_D(const QGraphicsWidget);
    QSizeF sh;
    if (d->layout) {
        QSizeF marginSize(0,0);
        if (d->margins) {
            marginSize = QSizeF(d->margins->left() + d->margins->right(),
                         d->margins->top() + d->margins->bottom());
        }
        sh = d->layout->effectiveSizeHint(which, constraint - marginSize);
        sh += marginSize;
    } else {
        switch (which) {
            case Qt::MinimumSize:
                sh = QSizeF(0, 0);
                break;
            case Qt::PreferredSize:
                sh = QSizeF(50, 50);    //rather arbitrary
                break;
            case Qt::MaximumSize:
                sh = QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
                break;
            default:
                qWarning("QGraphicsWidget::sizeHint(): Don't know how to handle the value of 'which'");
                break;
        }
    }
    return sh;
}